

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

DWARFDie __thiscall llvm::DWARFUnit::getParent(DWARFUnit *this,DWARFDebugInfoEntry *Die)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  uint local_34;
  uint32_t I;
  uint32_t ParentDepth;
  uint32_t Depth;
  DWARFDebugInfoEntry *Die_local;
  DWARFUnit *this_local;
  
  if (Die == (DWARFDebugInfoEntry *)0x0) {
    memset(&this_local,0,0x10);
    DWARFDie::DWARFDie((DWARFDie *)&this_local);
  }
  else {
    uVar1 = DWARFDebugInfoEntry::getDepth(Die);
    if (uVar1 == 0) {
      memset(&this_local,0,0x10);
      DWARFDie::DWARFDie((DWARFDie *)&this_local);
    }
    else if (uVar1 == 1) {
      _this_local = getUnitDIE(this,true);
    }
    else {
      local_34 = getDIEIndex(this,Die);
      do {
        local_34 = local_34 - 1;
        if (local_34 == 0) {
          memset(&this_local,0,0x10);
          DWARFDie::DWARFDie((DWARFDie *)&this_local);
          return _this_local;
        }
        pvVar3 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                 ::operator[](&this->DieArray,(ulong)local_34);
        uVar2 = DWARFDebugInfoEntry::getDepth(pvVar3);
      } while (uVar2 != uVar1 - 1);
      pvVar3 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
               operator[](&this->DieArray,(ulong)local_34);
      DWARFDie::DWARFDie((DWARFDie *)&this_local,this,pvVar3);
    }
  }
  return _this_local;
}

Assistant:

DWARFDie DWARFUnit::getParent(const DWARFDebugInfoEntry *Die) {
  if (!Die)
    return DWARFDie();
  const uint32_t Depth = Die->getDepth();
  // Unit DIEs always have a depth of zero and never have parents.
  if (Depth == 0)
    return DWARFDie();
  // Depth of 1 always means parent is the compile/type unit.
  if (Depth == 1)
    return getUnitDIE();
  // Look for previous DIE with a depth that is one less than the Die's depth.
  const uint32_t ParentDepth = Depth - 1;
  for (uint32_t I = getDIEIndex(Die) - 1; I > 0; --I) {
    if (DieArray[I].getDepth() == ParentDepth)
      return DWARFDie(this, &DieArray[I]);
  }
  return DWARFDie();
}